

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybi13.hpp
# Opt level: O2

error_code __thiscall
websocketpp::processor::hybi13<websocketpp::config::asio>::prepare_pong
          (hybi13<websocketpp::config::asio> *this,string *in,message_ptr *out)

{
  error_code eVar1;
  __shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_28;
  
  std::
  __shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&_Stack_28,
                 &out->
                  super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                );
  eVar1 = prepare_control(this,PONG,in,(message_ptr *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  eVar1._4_4_ = 0;
  return eVar1;
}

Assistant:

lib::error_code prepare_pong(std::string const & in, message_ptr out) const {
        return this->prepare_control(frame::opcode::PONG,in,out);
    }